

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

void h2o_config_dispose_pathconf(h2o_pathconf_t *pathconf)

{
  h2o_mimemap_type_t **pphVar1;
  size_t *psVar2;
  st_h2o_handler_t *__ptr;
  st_h2o_filter_t *__ptr_00;
  st_h2o_logger_t *__ptr_01;
  h2o_mimemap_t *phVar3;
  h2o_envconf_t *phVar4;
  code *pcVar5;
  size_t sVar6;
  
  if ((pathconf->handlers).size != 0) {
    sVar6 = 0;
    do {
      __ptr = (pathconf->handlers).entries[sVar6];
      if (__ptr->dispose != (_func_void_st_h2o_handler_t_ptr *)0x0) {
        (*__ptr->dispose)(__ptr);
      }
      free(__ptr);
      sVar6 = sVar6 + 1;
    } while (sVar6 != (pathconf->handlers).size);
  }
  free((pathconf->handlers).entries);
  if ((pathconf->filters).size != 0) {
    sVar6 = 0;
    do {
      __ptr_00 = (pathconf->filters).entries[sVar6];
      if (__ptr_00->dispose != (_func_void_st_h2o_filter_t_ptr *)0x0) {
        (*__ptr_00->dispose)(__ptr_00);
      }
      free(__ptr_00);
      sVar6 = sVar6 + 1;
    } while (sVar6 != (pathconf->filters).size);
  }
  free((pathconf->filters).entries);
  if ((pathconf->loggers).size != 0) {
    sVar6 = 0;
    do {
      __ptr_01 = (pathconf->loggers).entries[sVar6];
      if (__ptr_01->dispose != (_func_void_st_h2o_logger_t_ptr *)0x0) {
        (*__ptr_01->dispose)(__ptr_01);
      }
      free(__ptr_01);
      sVar6 = sVar6 + 1;
    } while (sVar6 != (pathconf->loggers).size);
  }
  free((pathconf->loggers).entries);
  free((pathconf->path).base);
  phVar3 = pathconf->mimemap;
  if (phVar3 != (h2o_mimemap_t *)0x0) {
    pphVar1 = &phVar3[-1].default_type;
    *pphVar1 = (h2o_mimemap_type_t *)((long)&(*pphVar1)[-1].data + 0x77);
    if (*pphVar1 == (h2o_mimemap_type_t *)0x0) {
      if ((code *)phVar3[-1].num_dynamic != (code *)0x0) {
        (*(code *)phVar3[-1].num_dynamic)();
      }
      free(&phVar3[-1].default_type);
    }
  }
  phVar4 = pathconf->env;
  if (phVar4 != (h2o_envconf_t *)0x0) {
    psVar2 = &phVar4[-1].sets.size;
    *psVar2 = *psVar2 - 1;
    if (*psVar2 == 0) {
      pcVar5 = (code *)phVar4[-1].sets.capacity;
      if (pcVar5 != (code *)0x0) {
        (*pcVar5)();
      }
      free(&phVar4[-1].sets.size);
      return;
    }
  }
  return;
}

Assistant:

void h2o_config_dispose_pathconf(h2o_pathconf_t *pathconf)
{
#define DESTROY_LIST(type, list)                                                                                                   \
    do {                                                                                                                           \
        size_t i;                                                                                                                  \
        for (i = 0; i != list.size; ++i) {                                                                                         \
            type *e = list.entries[i];                                                                                             \
            if (e->dispose != NULL)                                                                                                \
                e->dispose(e);                                                                                                     \
            free(e);                                                                                                               \
        }                                                                                                                          \
        free(list.entries);                                                                                                        \
    } while (0)
    DESTROY_LIST(h2o_handler_t, pathconf->handlers);
    DESTROY_LIST(h2o_filter_t, pathconf->filters);
    DESTROY_LIST(h2o_logger_t, pathconf->loggers);
#undef DESTROY_LIST

    free(pathconf->path.base);
    if (pathconf->mimemap != NULL)
        h2o_mem_release_shared(pathconf->mimemap);
    if (pathconf->env != NULL)
        h2o_mem_release_shared(pathconf->env);
}